

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

reference __thiscall
slang::SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>::
emplace_back<slang::ast::PortSymbol::NetTypeRange>
          (SmallVectorBase<slang::ast::PortSymbol::NetTypeRange> *this,NetTypeRange *args)

{
  ulong uVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  bitwidth_t bVar4;
  undefined4 uVar5;
  size_type sVar6;
  pointer pNVar7;
  pointer pNVar8;
  size_type sVar9;
  pointer pNVar10;
  long lVar11;
  ulong capacity;
  pointer pNVar12;
  
  pNVar12 = this->data_ + this->len;
  if (this->len == this->cap) {
    if (this->len == 0x7fffffffffffffff) {
      detail::throwLengthError();
    }
    capacity = this->len + 1;
    uVar1 = this->cap;
    if (capacity < uVar1 * 2) {
      capacity = uVar1 * 2;
    }
    if (0x7fffffffffffffff - uVar1 < uVar1) {
      capacity = 0x7fffffffffffffff;
    }
    lVar11 = (long)pNVar12 - (long)this->data_;
    pNVar7 = (pointer)detail::allocArray(capacity,0x10);
    uVar3 = *(undefined8 *)&args->width;
    *(undefined8 *)((long)pNVar7 + lVar11) = args->netType;
    ((undefined8 *)((long)pNVar7 + lVar11))[1] = uVar3;
    pNVar8 = this->data_;
    sVar9 = this->len;
    if (pNVar8 + sVar9 == pNVar12) {
      pNVar10 = pNVar7;
      if (sVar9 != 0) {
        do {
          bVar4 = pNVar8->width;
          uVar5 = *(undefined4 *)&pNVar8->field_0xc;
          pNVar10->netType = pNVar8->netType;
          pNVar10->width = bVar4;
          *(undefined4 *)&pNVar10->field_0xc = uVar5;
          pNVar8 = pNVar8 + 1;
          pNVar10 = pNVar10 + 1;
        } while (pNVar8 != pNVar12);
      }
    }
    else {
      pNVar10 = pNVar7;
      if (pNVar8 != pNVar12) {
        do {
          bVar4 = pNVar8->width;
          uVar5 = *(undefined4 *)&pNVar8->field_0xc;
          pNVar10->netType = pNVar8->netType;
          pNVar10->width = bVar4;
          *(undefined4 *)&pNVar10->field_0xc = uVar5;
          pNVar8 = pNVar8 + 1;
          pNVar10 = pNVar10 + 1;
        } while (pNVar8 != pNVar12);
        pNVar8 = this->data_;
        sVar9 = this->len;
      }
      if (pNVar8 + sVar9 != pNVar12) {
        puVar2 = (undefined8 *)((long)pNVar7 + lVar11);
        do {
          uVar3 = *(undefined8 *)&pNVar12->width;
          puVar2[2] = pNVar12->netType;
          puVar2[3] = uVar3;
          pNVar12 = pNVar12 + 1;
          puVar2 = puVar2 + 2;
        } while (pNVar12 != pNVar8 + sVar9);
      }
    }
    if (this->data_ != (pointer)this->firstElement) {
      free(this->data_);
    }
    this->len = this->len + 1;
    this->cap = capacity;
    this->data_ = pNVar7;
    return (reference)((long)pNVar7 + lVar11);
  }
  bVar4 = args->width;
  uVar5 = *(undefined4 *)&args->field_0xc;
  pNVar12->netType = args->netType;
  pNVar12->width = bVar4;
  *(undefined4 *)&pNVar12->field_0xc = uVar5;
  sVar9 = this->len;
  sVar6 = sVar9 + 1;
  this->len = sVar6;
  if (sVar6 == 0) {
    assert::assertFailed
              ("len",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/SmallVector.h"
               ,0x62,
               "reference slang::SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>::back() [T = slang::ast::PortSymbol::NetTypeRange]"
              );
  }
  return this->data_ + sVar9;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }